

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O1

uint16_t ProtocolTCP::ComputeChecksum
                   (uint8_t *packet,uint16_t length,uint8_t *sourceIP,uint8_t *targetIP)

{
  uint32_t uVar1;
  uint16_t uVar2;
  undefined6 in_register_00000032;
  undefined8 uVar3;
  
  uVar3 = CONCAT62(in_register_00000032,length);
  uVar1 = FCS::ChecksumAdd(sourceIP,4,0);
  uVar1 = FCS::ChecksumAdd(targetIP,4,uVar1);
  if ((length & 1) != 0) {
    packet[length] = '\0';
    length = length + 1;
  }
  uVar1 = FCS::ChecksumAdd(packet,(uint)length,(int)uVar3 + uVar1 + 6);
  uVar2 = FCS::ChecksumComplete(uVar1);
  return uVar2;
}

Assistant:

uint16_t ProtocolTCP::ComputeChecksum(uint8_t* packet,
                                      uint16_t length,
                                      const uint8_t* sourceIP,
                                      const uint8_t* targetIP)
{
    uint32_t checksum;
    uint16_t tmp;

    // A whole lot o' hokum just to compute the checksum
    checksum = FCS::ChecksumAdd(sourceIP, 4, 0);
    checksum = FCS::ChecksumAdd(targetIP, 4, checksum);
    checksum += 0x06; // protocol
    checksum += length;
    if ((length & 0x0001) != 0)
    {
        // length is odd
        tmp = length + 1;
        packet[length] = 0;
    }
    else
    {
        tmp = length;
    }
    checksum = FCS::ChecksumAdd(packet, tmp, checksum);

    return FCS::ChecksumComplete(checksum);
}